

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeVersionedName
          (cmGeneratorTarget *this,string *vName,string *prefix,string *base,string *suffix,
          string *name,char *version)

{
  cmMakefile *pcVar1;
  bool bVar2;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string local_50;
  
  pcVar1 = this->Makefile;
  local_58 = suffix;
  std::__cxx11::string::string((string *)&local_50,"APPLE",&local_79);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_50);
  if (bVar2) {
    std::operator+(&local_78,prefix,base);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,(string *)name);
  }
  std::__cxx11::string::_M_assign((string *)vName);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  if (version != (char *)0x0) {
    std::__cxx11::string::append((char *)vName);
    std::__cxx11::string::append((char *)vName);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_50,"APPLE",&local_79);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_50);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_78,(string *)local_58);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::append((string *)vName);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeVersionedName(std::string& vName,
                                             std::string const& prefix,
                                             std::string const& base,
                                             std::string const& suffix,
                                             std::string const& name,
                                             const char* version) const
{
  vName = this->Makefile->IsOn("APPLE") ? (prefix + base) : name;
  if (version) {
    vName += ".";
    vName += version;
  }
  vName += this->Makefile->IsOn("APPLE") ? suffix : std::string();
}